

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O2

CuString * CuStringNew(void)

{
  CuString *pCVar1;
  char *pcVar2;
  
  pCVar1 = (CuString *)malloc(0x10);
  pCVar1->length = 0;
  pCVar1->size = 0x100;
  pcVar2 = (char *)malloc(0x100);
  pCVar1->buffer = pcVar2;
  *pcVar2 = '\0';
  return pCVar1;
}

Assistant:

CuString* CuStringNew(void)
{
	CuString* str = (CuString*) malloc(sizeof(CuString));
	str->length = 0;
	str->size = STRING_MAX;
	str->buffer = (char*) malloc(sizeof(char) * ((unsigned int)str->size));
	str->buffer[0] = '\0';
	return str;
}